

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

void __thiscall
OpenMesh::PolyConnectivity::delete_face
          (PolyConnectivity *this,FaceHandle _fh,bool _delete_isolated_vertices)

{
  pointer pVVar1;
  bool bVar2;
  value_type _heh;
  HalfedgeHandle _heh_00;
  HalfedgeHandle _nheh;
  HalfedgeHandle _heh_01;
  BaseHandle BVar3;
  HalfedgeHandle HVar4;
  StatusInfo *pSVar5;
  Vertex *pVVar6;
  undefined7 in_register_00000011;
  undefined1 auVar7 [8];
  undefined1 auVar8 [8];
  undefined1 local_a8 [8];
  FaceHalfedgeIter fh_it;
  undefined1 auStack_88 [8];
  vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_> deleted_edges;
  undefined1 auStack_68 [8];
  vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> vhandles;
  BaseHandle local_48;
  undefined4 local_44;
  BaseHandle local_40;
  BaseHandle local_3c;
  BaseHandle local_38;
  BaseHandle local_34;
  
  local_44 = (undefined4)CONCAT71(in_register_00000011,_delete_isolated_vertices);
  if ((_fh.super_BaseHandle.idx_ != -1) &&
     (pSVar5 = ArrayKernel::status(&this->super_ArrayKernel,_fh), (pSVar5->status_ & 1) == 0)) {
    pSVar5 = ArrayKernel::status(&this->super_ArrayKernel,_fh);
    *(byte *)&pSVar5->status_ = (byte)pSVar5->status_ | 1;
    auStack_88 = (undefined1  [8])0x0;
    deleted_edges.super__Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    deleted_edges.super__Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>::reserve
              ((vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_> *)auStack_88,3);
    auStack_68 = (undefined1  [8])0x0;
    vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::reserve
              ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)auStack_68
               ,3);
    fh_iter((FaceHalfedgeIter *)local_a8,this,_fh);
    while ((fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
           (((int)fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
             fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
            (fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
             idx_ == 0))))) {
      _heh = Iterators::
             GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
             ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                          *)local_a8);
      ArrayKernel::set_boundary(&this->super_ArrayKernel,(HalfedgeHandle)_heh.super_BaseHandle.idx_)
      ;
      bVar2 = ArrayKernel::is_boundary
                        (&this->super_ArrayKernel,
                         (HalfedgeHandle)
                         ((-((uint)_heh.super_BaseHandle.idx_ & 1) | 1) +
                         (int)_heh.super_BaseHandle.idx_));
      if (bVar2) {
        local_48 = _heh.super_BaseHandle.idx_ >> 1;
        std::vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>::
        emplace_back<OpenMesh::EdgeHandle>
                  ((vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_> *)auStack_88
                   ,(EdgeHandle *)&local_48);
      }
      local_48.idx_ =
           (int)ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,_heh.super_BaseHandle.idx_);
      std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
      emplace_back<OpenMesh::VertexHandle>
                ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                 auStack_68,(VertexHandle *)&local_48);
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                    *)local_a8);
    }
    fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ =
         deleted_edges.
         super__Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>._M_impl.
         super__Vector_impl_data._M_start;
    auVar7 = auStack_88;
    auVar8 = auStack_68;
    pVVar1 = vhandles.
             super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (auStack_88 !=
        (undefined1  [8])
        deleted_edges.
        super__Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>._M_impl.
        super__Vector_impl_data._M_start) {
      while (auVar8 = auStack_68,
            pVVar1 = vhandles.
                     super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            auVar7 != (undefined1  [8])
                      fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_) {
        HVar4.super_BaseHandle.idx_ = (BaseHandle)((((pointer)auVar7)->super_BaseHandle).idx_ * 2);
        local_38.idx_ = (int)ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,HVar4);
        local_3c.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar4);
        local_40.idx_ = (int)HVar4.super_BaseHandle.idx_;
        _heh_00 = ArrayKernel::prev_halfedge_handle
                            (&this->super_ArrayKernel,HVar4.super_BaseHandle.idx_);
        HVar4.super_BaseHandle.idx_ =
             (BaseHandle)((((pointer)auVar7)->super_BaseHandle).idx_ * 2 + 1);
        vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auVar7;
        local_34.idx_ = (int)ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,HVar4);
        _nheh = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar4);
        _heh_01 = ArrayKernel::prev_halfedge_handle
                            (&this->super_ArrayKernel,HVar4.super_BaseHandle.idx_);
        ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh_00,_nheh);
        ArrayKernel::set_next_halfedge_handle
                  (&this->super_ArrayKernel,_heh_01,(HalfedgeHandle)local_3c.idx_);
        if ((this->super_ArrayKernel).edge_status_.
            super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_ != -1) {
          pSVar5 = ArrayKernel::status(&this->super_ArrayKernel,
                                       (EdgeHandle)
                                       ((vhandles.
                                         super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       super_BaseHandle).idx_);
          *(byte *)&pSVar5->status_ = (byte)pSVar5->status_ | 1;
        }
        if ((this->super_ArrayKernel).halfedge_status_.
            super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_ != -1) {
          pSVar5 = ArrayKernel::status(&this->super_ArrayKernel,(HalfedgeHandle)local_40.idx_);
          *(byte *)&pSVar5->status_ = (byte)pSVar5->status_ | 1;
          pSVar5 = ArrayKernel::status(&this->super_ArrayKernel,HVar4);
          *(byte *)&pSVar5->status_ = (byte)pSVar5->status_ | 1;
        }
        BVar3.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,local_38.idx_);
        if ((BaseHandle)BVar3.idx_ == HVar4.super_BaseHandle.idx_) {
          if ((BaseHandle)local_3c.idx_ == HVar4.super_BaseHandle.idx_) {
            if ((char)local_44 != '\0') {
              pSVar5 = ArrayKernel::status(&this->super_ArrayKernel,(VertexHandle)local_38.idx_);
              *(byte *)&pSVar5->status_ = (byte)pSVar5->status_ | 1;
            }
            ArrayKernel::set_isolated(&this->super_ArrayKernel,(VertexHandle)local_38.idx_);
          }
          else {
            pVVar6 = ArrayKernel::vertex(&this->super_ArrayKernel,(VertexHandle)local_38.idx_);
            (pVVar6->halfedge_handle_).super_BaseHandle.idx_ = local_3c.idx_;
          }
        }
        HVar4 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,(VertexHandle)local_34.idx_);
        if (HVar4.super_BaseHandle.idx_ == (BaseHandle)local_40.idx_) {
          if (_nheh.super_BaseHandle.idx_ == (BaseHandle)local_40.idx_) {
            if ((char)local_44 != '\0') {
              pSVar5 = ArrayKernel::status(&this->super_ArrayKernel,(VertexHandle)local_34.idx_);
              *(byte *)&pSVar5->status_ = (byte)pSVar5->status_ | 1;
            }
            ArrayKernel::set_isolated(&this->super_ArrayKernel,(VertexHandle)local_34.idx_);
          }
          else {
            pVVar6 = ArrayKernel::vertex(&this->super_ArrayKernel,(VertexHandle)local_34.idx_);
            (pVVar6->halfedge_handle_).super_BaseHandle.idx_ = (int)_nheh.super_BaseHandle.idx_;
          }
        }
        auVar7 = (undefined1  [8])
                 (vhandles.
                  super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
    }
    for (; auVar8 != (undefined1  [8])pVVar1; auVar8 = (undefined1  [8])((long)auVar8 + 4)) {
      adjust_outgoing_halfedge(this,(VertexHandle)(((pointer)auVar8)->super_BaseHandle).idx_);
    }
    std::_Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
    ~_Vector_base((_Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                  auStack_68);
    std::_Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>::~_Vector_base
              ((_Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_> *)
               auStack_88);
    return;
  }
  __assert_fail("_fh.is_valid() && !status(_fh).deleted()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                ,0x1f8,"void OpenMesh::PolyConnectivity::delete_face(FaceHandle, bool)");
}

Assistant:

void PolyConnectivity::delete_face(FaceHandle _fh, bool _delete_isolated_vertices)
{
  assert(_fh.is_valid() && !status(_fh).deleted());

  // mark face deleted
  status(_fh).set_deleted(true);


  // this vector will hold all boundary edges of face _fh
  // these edges will be deleted
  std::vector<EdgeHandle> deleted_edges;
  deleted_edges.reserve(3);


  // this vector will hold all vertices of face _fh
  // for updating their outgoing halfedge
  std::vector<VertexHandle>  vhandles;
  vhandles.reserve(3);


  // for all halfedges of face _fh do:
  //   1) invalidate face handle.
  //   2) collect all boundary halfedges, set them deleted
  //   3) store vertex handles
  HalfedgeHandle hh;
  for (FaceHalfedgeIter fh_it(fh_iter(_fh)); fh_it.is_valid(); ++fh_it)
  {
    hh = *fh_it;

    set_boundary(hh);//set_face_handle(hh, InvalidFaceHandle);

    if (is_boundary(opposite_halfedge_handle(hh)))
        deleted_edges.push_back(edge_handle(hh));

    vhandles.push_back(to_vertex_handle(hh));
  }


  // delete all collected (half)edges
  // these edges were all boundary
  // delete isolated vertices (if _delete_isolated_vertices is true)
  if (!deleted_edges.empty())
  {
    std::vector<EdgeHandle>::iterator del_it(deleted_edges.begin()),
                                      del_end(deleted_edges.end());
    HalfedgeHandle h0, h1, next0, next1, prev0, prev1;
    VertexHandle   v0, v1;

    for (; del_it!=del_end; ++del_it)
    {
      h0    = halfedge_handle(*del_it, 0);
      v0    = to_vertex_handle(h0);
      next0 = next_halfedge_handle(h0);
      prev0 = prev_halfedge_handle(h0);

      h1    = halfedge_handle(*del_it, 1);
      v1    = to_vertex_handle(h1);
      next1 = next_halfedge_handle(h1);
      prev1 = prev_halfedge_handle(h1);

      // adjust next and prev handles
      set_next_halfedge_handle(prev0, next1);
      set_next_halfedge_handle(prev1, next0);

      // mark edge deleted if the mesh has a edge status
      if ( has_edge_status() )
    	 status(*del_it).set_deleted(true);


      // mark corresponding halfedges as deleted
      // As the deleted edge is boundary,
      // all corresponding halfedges will also be deleted.
      if ( has_halfedge_status() ) {
        status(h0).set_deleted(true);
        status(h1).set_deleted(true);
      }

      // update v0
      if (halfedge_handle(v0) == h1)
      {
        // isolated ?
        if (next0 == h1)
        {
          if (_delete_isolated_vertices)
            status(v0).set_deleted(true);
          set_isolated(v0);
        }
        else set_halfedge_handle(v0, next0);
      }

      // update v1
      if (halfedge_handle(v1) == h0)
      {
        // isolated ?
        if (next1 == h0)
        {
          if (_delete_isolated_vertices)
            status(v1).set_deleted(true);
          set_isolated(v1);
        }
        else  set_halfedge_handle(v1, next1);
      }
    }
  }

  // update outgoing halfedge handles of remaining vertices
  std::vector<VertexHandle>::iterator v_it(vhandles.begin()),
                                      v_end(vhandles.end());
  for (; v_it!=v_end; ++v_it)
    adjust_outgoing_halfedge(*v_it);
}